

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

bool Internal_IsSubDFriendlyEnd
               (int endex,double *cubic_cpan_knots,ON_3dPoint *cv0,ON_3dPoint *cv1,ON_3dPoint *cv2)

{
  double dVar1;
  double dVar2;
  double e;
  double tol;
  double d;
  ON_3dPoint local_f0;
  ON_3dPoint local_d8;
  ON_3dPoint local_c0;
  ON_3dPoint local_a8;
  ON_3dPoint local_90;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  undefined1 local_48 [8];
  ON_3dPoint Q;
  ON_3dPoint *cv2_local;
  ON_3dPoint *cv1_local;
  ON_3dPoint *cv0_local;
  double *cubic_cpan_knots_local;
  int endex_local;
  
  Q.z = (double)cv2;
  if (endex == 0) {
    if (((*cubic_cpan_knots != cubic_cpan_knots[2]) ||
        (NAN(*cubic_cpan_knots) || NAN(cubic_cpan_knots[2]))) ||
       (cubic_cpan_knots[5] <= cubic_cpan_knots[3])) {
      ON_3dPoint::operator+(&local_a8,cv0,cv2);
      operator*(&local_60,0.5,&local_a8);
    }
    else {
      operator*(&local_90,2.0,cv0);
      ON_3dPoint::operator+(&local_78,&local_90,(ON_3dPoint *)Q.z);
      ON_3dPoint::operator/(&local_60,&local_78,3.0);
    }
    local_48 = (undefined1  [8])local_60.x;
    Q.x = local_60.y;
    Q.y = local_60.z;
  }
  else {
    if (((cubic_cpan_knots[2] <= *cubic_cpan_knots) || (cubic_cpan_knots[3] != cubic_cpan_knots[5]))
       || (NAN(cubic_cpan_knots[3]) || NAN(cubic_cpan_knots[5]))) {
      ON_3dPoint::operator+((ON_3dPoint *)&d,cv0,cv2);
      operator*(&local_c0,0.5,(ON_3dPoint *)&d);
    }
    else {
      operator*(&local_f0,2.0,cv2);
      ON_3dPoint::operator+(&local_d8,cv0,&local_f0);
      ON_3dPoint::operator/(&local_c0,&local_d8,3.0);
    }
    local_48 = (undefined1  [8])local_c0.x;
    Q.x = local_c0.y;
    Q.y = local_c0.z;
  }
  dVar1 = ON_3dPoint::DistanceTo(cv0,(ON_3dPoint *)Q.z);
  dVar2 = ON_3dPoint::DistanceTo(cv1,(ON_3dPoint *)local_48);
  return dVar2 <= dVar1 * 1e-06;
}

Assistant:

static bool Internal_IsSubDFriendlyEnd(
  int endex,
  const double* cubic_cpan_knots,
  const ON_3dPoint& cv0,
  const ON_3dPoint& cv1,
  const ON_3dPoint& cv2
)
{
  ON_3dPoint Q;
  if (0 == endex)
  {
    Q = (cubic_cpan_knots[0] == cubic_cpan_knots[2] && cubic_cpan_knots[3] < cubic_cpan_knots[5])
      ? ((2.0*cv0 + cv2) / 3.0)
      : (0.5*(cv0 + cv2))
      ;
  }
  else
  {
    Q = (cubic_cpan_knots[0] < cubic_cpan_knots[2] && cubic_cpan_knots[3] == cubic_cpan_knots[5])
      ? ((cv0 + 2.0*cv2) / 3.0)
      : (0.5*(cv0 + cv2))
      ;
  }
  const double d = cv0.DistanceTo(cv2);
  const double tol = 1.0e-6*d;
  const double e = cv1.DistanceTo(Q);
  return (e <= tol);
}